

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O3

int __thiscall AvlTree<Worker>::find(AvlTree<Worker> *this,Worker *obj)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<AvlTree<Worker>::Node> *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  shared_ptr<AvlTree<Worker>::Node> it;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_40 = (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_38._M_pi =
       (this->m_Root).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar3 = -1;
  if (local_40 != (element_type *)0x0) {
    iVar4 = 0;
    do {
      iVar5 = (local_40->key).Salary;
      if (obj->Salary < iVar5) {
        psVar2 = &local_40->left;
        local_40 = (local_40->left).
                   super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      else {
        peVar1 = (local_40->left).
                 super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_00 = (local_40->left).
                  super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (obj->Salary <= iVar5) {
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          if (peVar1 == (element_type *)0x0) {
            iVar3 = 0;
          }
          else {
            iVar3 = peVar1->size;
          }
          iVar3 = iVar3 + iVar4;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          break;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (peVar1 == (element_type *)0x0) {
          iVar5 = 1;
        }
        else {
          iVar5 = peVar1->size + 1;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        iVar4 = iVar4 + iVar5;
        psVar2 = &local_40->right;
        local_40 = (local_40->right).
                   super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_38,
                 &(psVar2->super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
    } while (local_40 != (element_type *)0x0);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  return iVar3;
}

Assistant:

int find(const T& obj) const
    {
        int foundIndex = 0;
        auto it = m_Root;

        while(it != nullptr)
        {
            if(!(obj < it->key) && !(it->key < obj))
                return foundIndex + _size(it->left);
            if(obj < it->key)
            {
                it = it->left;
            }
            else
            {
                foundIndex += _size(it->left) + 1;
                it = it->right;
            }
        }
        return -1;
    }